

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

int absl::lts_20240722::base_internal::LLA_SkiplistLevels(size_t size,size_t base,uint32_t *random)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint32_t uVar5;
  
  uVar2 = size - 0x28;
  lVar3 = 0;
  for (; base < size; size = size >> 1) {
    lVar3 = lVar3 + 1;
  }
  uVar2 = uVar2 >> 3;
  if (random == (uint32_t *)0x0) {
    uVar4 = 1;
  }
  else {
    uVar5 = *random;
    uVar4 = 0;
    do {
      uVar5 = uVar5 * 0x41c64e6d + 0x3039;
      uVar4 = uVar4 + 1;
    } while ((uVar5 >> 0x1e & 1) == 0);
    *random = uVar5;
  }
  uVar1 = (uint)((ulong)uVar4 + lVar3);
  if (uVar2 < (ulong)uVar4 + lVar3) {
    uVar1 = (uint)uVar2;
  }
  if (0 < (int)uVar1) {
    uVar4 = 0x1d;
    if (uVar1 < 0x1d) {
      uVar4 = uVar1;
    }
    return uVar4;
  }
  absl::lts_20240722::raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x94,"Check %s failed: %s","level >= 1",
             "block not big enough for even one level",uVar2);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                ,0x94,"int absl::base_internal::LLA_SkiplistLevels(size_t, size_t, uint32_t *)");
}

Assistant:

static int LLA_SkiplistLevels(size_t size, size_t base, uint32_t *random) {
  // max_fit is the maximum number of levels that will fit in a node for the
  // given size.   We can't return more than max_fit, no matter what the
  // random number generator says.
  size_t max_fit = (size - offsetof(AllocList, next)) / sizeof(AllocList *);
  int level = IntLog2(size, base) + (random != nullptr ? Random(random) : 1);
  if (static_cast<size_t>(level) > max_fit) level = static_cast<int>(max_fit);
  if (level > kMaxLevel - 1) level = kMaxLevel - 1;
  ABSL_RAW_CHECK(level >= 1, "block not big enough for even one level");
  return level;
}